

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_CutRef_rec(Of_Man_t *p,int *pCut)

{
  int iVar1;
  int *pCut_00;
  bool bVar2;
  int local_28;
  int local_24;
  int local_20;
  int Count;
  int Var;
  int i;
  int *pCut_local;
  Of_Man_t *p_local;
  
  if ((p->Iter & 1U) == 0) {
    iVar1 = Of_CutSize(pCut);
    local_28 = Of_CutArea(p,iVar1);
  }
  else {
    local_28 = 1;
  }
  local_24 = local_28;
  Count = 0;
  while( true ) {
    iVar1 = Of_CutSize(pCut);
    bVar2 = false;
    if (Count < iVar1) {
      local_20 = Of_CutVar(pCut,Count);
      bVar2 = local_20 != 0;
    }
    if (!bVar2) break;
    iVar1 = Of_ObjCutBest(p,local_20);
    if (iVar1 != 0) {
      iVar1 = Of_ObjRefInc(p,local_20);
      if (iVar1 == 0) {
        pCut_00 = Of_ObjCutBestP(p,local_20);
        iVar1 = Of_CutRef_rec(p,pCut_00);
        local_24 = iVar1 + local_24;
      }
    }
    Count = Count + 1;
  }
  return local_24;
}

Assistant:

int Of_CutRef_rec( Of_Man_t * p, int * pCut )
{
    int i, Var, Count = (p->Iter & 1) ? 1 : Of_CutArea(p, Of_CutSize(pCut));
    Of_CutForEachVar( pCut, Var, i )
        if ( Of_ObjCutBest(p, Var) && !Of_ObjRefInc(p, Var) )
            Count += Of_CutRef_rec( p, Of_ObjCutBestP(p, Var) );
    return Count;
}